

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitFactoredDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
PlanningUnitFactoredDecPOMDPDiscrete::ComputeFSAOHDist
          (PlanningUnitFactoredDecPOMDPDiscrete *this,FactoredStateAOHDistribution *fsaoh,
          PartialJointPolicyDiscretePure *pJPol)

{
  size_t sVar1;
  FactoredDecPOMDPDiscreteInterface *pFVar2;
  undefined8 uVar3;
  JointPolicy *in_RDX;
  long *in_RSI;
  PlanningUnitFactoredDecPOMDPDiscrete *in_RDI;
  Index t;
  Index lastStage;
  Index depth;
  uint local_24;
  
  sVar1 = JointPolicy::GetDepth(in_RDX);
  pFVar2 = GetFDPOMDPD(in_RDI);
  uVar3 = (**(code **)(*(long *)(&pFVar2->field_0x0 + *(long *)(*(long *)pFVar2 + -0xf8)) + 0x188))
                    (&pFVar2->field_0x0 + *(long *)(*(long *)pFVar2 + -0xf8));
  (**(code **)(*in_RSI + 0x38))(in_RSI,uVar3);
  (**(code **)(*in_RSI + 0x40))();
  if ((uint)sVar1 != 0) {
    for (local_24 = 0; local_24 < (uint)sVar1; local_24 = local_24 + 1) {
      (**(code **)(*in_RSI + 0x30))(in_RSI,in_RDX);
    }
  }
  return;
}

Assistant:

void PlanningUnitFactoredDecPOMDPDiscrete::
ComputeFSAOHDist(
        FactoredStateAOHDistribution* fsaoh, 
        const PartialJointPolicyDiscretePure& pJPol) const
{
    Index depth = pJPol.GetDepth();
    //cout << "computing factored FSAOHDist for policy of depth"<< depth<<endl;
    fsaoh->InitializeFromISD( GetFDPOMDPD()->GetFactoredISD() );
    fsaoh->SanityCheck();
    Index lastStage;
    if(depth > 0)
        //depth 1 specifies action for t=0 -> compute FSAOH for t=1
        lastStage = depth; 
    else
        return;

    //cerr<<"starting updates from t=0 to t<"<<lastStage<<endl;
    for(Index t=0 ; t < lastStage; t++)
        fsaoh->Update(pJPol);
}